

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributes::FindDisplayMaterialId
          (ON_3dmObjectAttributes *this,ON_UUID *viewport_id,ON_UUID *display_material_id)

{
  int iVar1;
  undefined1 local_64 [8];
  ON_DisplayMaterialRef found_material;
  ON_DisplayMaterialRef search_material;
  bool rc;
  ON_UUID *display_material_id_local;
  ON_UUID *viewport_id_local;
  ON_3dmObjectAttributes *this_local;
  
  search_material.m_display_material_id.Data4[3] = '\0';
  iVar1 = ON_SimpleArray<ON_DisplayMaterialRef>::Count(&this->m_dmref);
  if (0 < iVar1) {
    ON_DisplayMaterialRef::ON_DisplayMaterialRef
              ((ON_DisplayMaterialRef *)found_material.m_display_material_id.Data4);
    ON_DisplayMaterialRef::ON_DisplayMaterialRef((ON_DisplayMaterialRef *)local_64);
    found_material.m_display_material_id.Data4 = *(uchar (*) [8])viewport_id;
    search_material.m_display_material_id.Data4[3] =
         FindDisplayMaterialRef
                   (this,(ON_DisplayMaterialRef *)found_material.m_display_material_id.Data4,
                    (ON_DisplayMaterialRef *)local_64);
    if (((bool)search_material.m_display_material_id.Data4[3]) &&
       (display_material_id != (ON_UUID *)0x0)) {
      *(uchar (*) [8])display_material_id = found_material.m_viewport_id.Data4;
      *(undefined8 *)display_material_id->Data4 = found_material.m_display_material_id._0_8_;
    }
  }
  return (bool)search_material.m_display_material_id.Data4[3];
}

Assistant:

bool ON_3dmObjectAttributes::FindDisplayMaterialId( 
      const ON_UUID& viewport_id, 
      ON_UUID* display_material_id
      ) const
{
  bool rc = false;
  if ( m_dmref.Count() > 0 )
  {
    ON_DisplayMaterialRef search_material, found_material;
    search_material.m_viewport_id = viewport_id;
    if ( 0 != (rc = FindDisplayMaterialRef(search_material,&found_material)) )
    {
      if ( display_material_id )
        *display_material_id = found_material.m_display_material_id;
    }
  }
  return rc;
}